

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O3

void __thiscall CPU::INC_AB_X(CPU *this)

{
  byte bVar1;
  uint16_t uVar2;
  int iVar3;
  uint uVar4;
  
  this->cycles = 7;
  uVar2 = GetWord(this);
  this->cycles = this->cycles - 1;
  uVar4 = (uint)this->X + (uint)uVar2 & 0xffff;
  iVar3 = (*this->memory->_vptr_MemoryBus[2])(this->memory,(ulong)uVar4);
  this->cycles = this->cycles - 2;
  bVar1 = (char)iVar3 + 1;
  (*this->memory->_vptr_MemoryBus[3])(this->memory,(ulong)uVar4,(ulong)bVar1);
  this->cycles = this->cycles - 1;
  (this->field_6).ps = (this->field_6).ps & 0x7d | bVar1 & 0x80;
  return;
}

Assistant:

void CPU::INC_AB_X()
{
    cycles = 7;
    uint16_t addr = GetWord() + X, result = ReadByte(addr) + 1;
    cycles -= 2;
    WriteByte(addr, result);
    Z = (result == 0);
    N = (result & 0b10000000) > 0;
}